

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappingTypes.hpp
# Opt level: O1

ostream * operator<<(ostream *os,LongReadMapping *m)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"LongReadMapping ",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->qStart);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->qEnd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") -> ",5);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->nStart);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->nEnd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")  ",3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->score);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," hits",5);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const LongReadMapping& m){
        os << "LongReadMapping " << m.read_id << " (" << m.qStart << ":" << m.qEnd << ") -> "
                                  << m.node << " (" << m.nStart << ":" << m.nEnd << ")  " <<m.score<< " hits";
        return os;
    }